

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O2

char * INT_create_router_action_spec(FMStructDescList format_list,char *function)

{
  FMStructDescList p_Var1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar5 = 0;
  for (p_Var1 = format_list;
      (format_list != (FMStructDescList)0x0 && (p_Var1->format_name != (char *)0x0));
      p_Var1 = p_Var1 + 1) {
    uVar5 = uVar5 + 1;
  }
  pcVar2 = (char *)INT_CMmalloc(0x32);
  sprintf(pcVar2,"Router Action   Format Count %d\n",uVar5 & 0xffffffff);
  while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
    pcVar2 = add_FMfieldlist_to_string(pcVar2,format_list);
    format_list = format_list + 1;
  }
  sVar3 = strlen(pcVar2);
  sVar4 = strlen(function);
  pcVar2 = (char *)INT_CMrealloc(pcVar2,sVar3 + sVar4 + 1);
  sVar3 = strlen(pcVar2);
  strcpy(pcVar2 + sVar3,function);
  return pcVar2;
}

Assistant:

char *
INT_create_router_action_spec(FMStructDescList format_list, char *function)
{
    int format_count = 0;
    int i;
    char *str;
    while(format_list && (format_list[format_count].format_name != NULL)) format_count++;
    str = malloc(50);
    sprintf(str, "Router Action   Format Count %d\n", format_count);

    for (i = 0 ; i < format_count; i++) {
	str = add_FMfieldlist_to_string(str, &format_list[i]);
    }
    str = realloc(str, strlen(str) + strlen(function) + 1);
    strcpy(&str[strlen(str)], function);
    return str;
}